

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_new(lua_State *L)

{
  GCobj *t_00;
  CType *ct_00;
  CTState *pCVar1;
  CTSize nelem;
  GCcdata *pGVar2;
  cTValue *pcVar3;
  ulong uVar4;
  cTValue *local_198;
  cTValue *local_190;
  GCtab *t;
  cTValue *tv;
  GCcdata *cd;
  TValue *o;
  CTInfo info;
  CTSize sz;
  CType *ct;
  CTState *pCStack_140;
  CTypeID id;
  CTState *cts;
  lua_State *L_local;
  CTState *cts_1;
  cTValue *local_120;
  TValue *local_118;
  CTState *local_110;
  char *local_108;
  TValue *local_100;
  CTState *local_f8;
  CType *local_f0;
  CType *ct_1;
  CTState *local_e0;
  CTypeID local_d4;
  CTState *local_d0;
  CType *local_c8;
  CTState *local_c0;
  uint local_b4;
  CTState *local_b0;
  uint local_a4;
  CTState *local_a0;
  CTypeID local_94;
  CTState *local_90;
  GCcdata *local_88;
  uint8_t *local_80;
  CTState *local_78;
  undefined4 local_6c;
  GCcdata *local_68;
  uint8_t *local_60;
  CTState *local_58;
  undefined4 local_4c;
  GCcdata *local_48;
  uint8_t *local_40;
  char *local_38;
  uint8_t *local_30;
  CTState *local_28;
  GCobj *local_20;
  GCobj *o_1;
  lua_State *local_10;
  
  pCStack_140 = *(CTState **)((L->glref).ptr64 + 0x180);
  pCStack_140->L = L;
  cts = (CTState *)L;
  L_local = (lua_State *)pCStack_140;
  cts_1 = (CTState *)L;
  ct._4_4_ = ffi_checkctype(L,pCStack_140,(TValue *)0x0);
  local_e0 = pCStack_140;
  local_d0 = pCStack_140;
  local_90 = pCStack_140;
  local_f0 = pCStack_140->tab + ct._4_4_;
  while (local_f0->info >> 0x1c == 8) {
    local_c0 = pCStack_140;
    local_c8 = local_f0;
    local_b0 = pCStack_140;
    local_b4 = local_f0->info & 0xffff;
    local_a0 = pCStack_140;
    local_a4 = local_b4;
    local_f0 = pCStack_140->tab + local_b4;
  }
  _info = local_f0;
  ct_1._4_4_ = ct._4_4_;
  local_d4 = ct._4_4_;
  local_94 = ct._4_4_;
  o._0_4_ = lj_ctype_info(pCStack_140,ct._4_4_,(CTSize *)((long)&o + 4));
  pCVar1 = pCStack_140;
  ct_00 = _info;
  cd = (GCcdata *)&cts->finalizer->marked;
  if (((CTInfo)o & 0x100000) != 0) {
    cd = (GCcdata *)&cts->finalizer->array;
    nelem = ffi_checkint((lua_State *)cts,2);
    o._4_4_ = lj_ctype_vlsize(pCVar1,ct_00,nelem);
  }
  if (o._4_4_ != 0xffffffff) {
    pGVar2 = lj_cdata_newx(pCStack_140,ct._4_4_,o._4_4_,(CTInfo)o);
    local_80 = &cd[-1].marked;
    local_78 = cts;
    local_58 = cts;
    local_6c = 0xfffffff5;
    local_4c = 0xfffffff5;
    uVar4 = (ulong)pGVar2 | 0xfffa800000000000;
    cd[-1].marked = (char)uVar4;
    cd[-1].gct = (char)(uVar4 >> 8);
    cd[-1].ctypeid = (short)(uVar4 >> 0x10);
    *(int *)&cd[-1].field_0xc = (int)(uVar4 >> 0x20);
    local_28 = cts;
    local_38 = "store to dead GC object";
    local_88 = pGVar2;
    local_68 = pGVar2;
    local_60 = local_80;
    local_48 = pGVar2;
    local_40 = local_80;
    local_30 = local_80;
    lj_cconv_ct_init(pCStack_140,_info,o._4_4_,(uint8_t *)(pGVar2 + 1),(TValue *)cd,
                     (MSize)((long)cts->miscmap - (long)cd >> 3));
    if (((_info->info >> 0x1c == 1) &&
        (pcVar3 = lj_tab_getinth(pCStack_140->miscmap,-ct._4_4_), pcVar3 != (cTValue *)0x0)) &&
       ((int)(pcVar3->field_4).it >> 0xf == -0xc)) {
      if ((pcVar3->u64 & 0x7fffffffffff) == 0) {
        local_190 = (cTValue *)0x0;
      }
      else {
        if ((*(byte *)((pcVar3->u64 & 0x7fffffffffff) + 10) & 4) == 0) {
          local_198 = lj_meta_cache((GCtab *)(pcVar3->u64 & 0x7fffffffffff),MM_gc,
                                    (GCstr *)cts->L[3].exdata2);
        }
        else {
          local_198 = (cTValue *)0x0;
        }
        local_190 = local_198;
      }
      pCVar1 = cts;
      if ((local_190 != (cTValue *)0x0) &&
         (t_00 = (GCobj *)pCStack_140->finalizer, (t_00->gch).metatable.gcptr64 != 0)) {
        local_118 = lj_tab_set((lua_State *)cts,&t_00->tab,(cTValue *)&cd[-1].marked);
        local_110 = pCVar1;
        local_120 = local_190;
        *local_118 = *local_190;
        local_f8 = pCVar1;
        local_108 = "copy of dead GC object";
        if (((t_00->gch).marked & 4) != 0) {
          local_10 = cts->L;
          (t_00->gch).marked = (t_00->gch).marked & 0xfb;
          (t_00->gch).gclist.gcptr64 = (local_10->openupval).gcptr64;
          (local_10->openupval).gcptr64 = (uint64_t)t_00;
          local_20 = t_00;
          o_1 = t_00;
        }
        pGVar2->marked = pGVar2->marked | 0x10;
        local_100 = local_118;
      }
    }
    cts->miscmap = (GCtab *)cd;
    if ((cts->L->gclist).gcptr64 <= (cts->L->glref).ptr64) {
      lj_gc_step((lua_State *)cts);
    }
    return 1;
  }
  lj_err_arg((lua_State *)cts,1,LJ_ERR_FFI_INVSIZE);
}

Assistant:

LJLIB_CF(ffi_new)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CType *ct = ctype_raw(cts, id);
  CTSize sz;
  CTInfo info = lj_ctype_info(cts, id, &sz);
  TValue *o = L->base+1;
  GCcdata *cd;
  if ((info & CTF_VLA)) {
    o++;
    sz = lj_ctype_vlsize(cts, ct, (CTSize)ffi_checkint(L, 2));
  }
  if (sz == CTSIZE_INVALID)
    lj_err_arg(L, 1, LJ_ERR_FFI_INVSIZE);
  cd = lj_cdata_newx(cts, id, sz, info);
  setcdataV(L, o-1, cd);  /* Anchor the uninitialized cdata. */
  lj_cconv_ct_init(cts, ct, sz, cdataptr(cd),
		   o, (MSize)(L->top - o));  /* Initialize cdata. */
  if (ctype_isstruct(ct->info)) {
    /* Handle ctype __gc metamethod. Use the fast lookup here. */
    cTValue *tv = lj_tab_getinth(cts->miscmap, -(int32_t)id);
    if (tv && tvistab(tv) && (tv = lj_meta_fast(L, tabV(tv), MM_gc))) {
      GCtab *t = cts->finalizer;
      if (gcref(t->metatable)) {
	/* Add to finalizer table, if still enabled. */
	copyTV(L, lj_tab_set(L, t, o-1), tv);
	lj_gc_anybarriert(L, t);
	cd->marked |= LJ_GC_CDATA_FIN;
      }
    }
  }
  L->top = o;  /* Only return the cdata itself. */
  lj_gc_check(L);
  return 1;
}